

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkUtil.c
# Opt level: O1

int Nwk_NodeCompareLevelsDecrease(Nwk_Obj_t **pp1,Nwk_Obj_t **pp2)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = (*pp1)->Level - (*pp2)->Level;
  uVar2 = 0xffffffff;
  if ((int)uVar1 < 1) {
    uVar2 = uVar1 >> 0x1f;
  }
  return uVar2;
}

Assistant:

int Nwk_NodeCompareLevelsDecrease( Nwk_Obj_t ** pp1, Nwk_Obj_t ** pp2 )
{
    int Diff = (*pp1)->Level - (*pp2)->Level;
    if ( Diff > 0 )
        return -1;
    if ( Diff < 0 ) 
        return 1;
    return 0; 
}